

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O2

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  byte bVar1;
  jpeg_entropy_decoder *pjVar2;
  int *piVar3;
  JBLOCKROW paJVar4;
  jpeg_error_mgr *pjVar5;
  short sVar6;
  short sVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var16;
  uint local_54;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    iVar8 = *(int *)((long)&pjVar2[4].start_pass + 4);
    if (iVar8 == 0) {
      process_restart(cinfo);
      iVar8 = *(int *)((long)&pjVar2[4].start_pass + 4);
    }
    *(int *)((long)&pjVar2[4].start_pass + 4) = iVar8 + -1;
  }
  if (*(int *)&pjVar2[2].start_pass != -1) {
    piVar3 = cinfo->natural_order;
    paJVar4 = *MCU_data;
    bVar1 = (byte)cinfo->Al;
    iVar8 = cinfo->cur_comp_info[0]->ac_tbl_no;
    uVar9 = cinfo->Se;
    uVar12 = uVar9;
    while ((local_54 = (int)uVar9 >> 0x1f & uVar9, 0 < (int)uVar12 &&
           (local_54 = uVar12, (*paJVar4)[piVar3[uVar12]] == 0))) {
      uVar12 = uVar12 - 1;
    }
    iVar13 = cinfo->Ss;
    while (iVar13 <= (int)uVar9) {
      p_Var16 = (&pjVar2[0xc].decode_mcu)[iVar8];
      lVar15 = (long)(iVar13 * 3 + -3);
      if (((int)local_54 < iVar13) &&
         (iVar10 = arith_decode(cinfo,(uchar *)(p_Var16 + lVar15)), iVar10 != 0)) {
        return 1;
      }
      lVar14 = (long)iVar13 + -1;
      p_Var16 = p_Var16 + lVar15 + 2;
      while( true ) {
        iVar13 = iVar13 + 1;
        iVar10 = piVar3[lVar14 + 1];
        sVar7 = (short)(1 << (bVar1 & 0x1f));
        sVar6 = (short)(-1 << (bVar1 & 0x1f));
        if ((*paJVar4)[iVar10] != 0) break;
        iVar11 = arith_decode(cinfo,(uchar *)(p_Var16 + -1));
        if (iVar11 != 0) {
          iVar11 = arith_decode(cinfo,(uchar *)&pjVar2[0x14].decode_mcu);
          if (iVar11 != 0) {
            sVar7 = sVar6;
          }
          (*paJVar4)[iVar10] = sVar7;
          goto LAB_0011312f;
        }
        lVar14 = lVar14 + 1;
        p_Var16 = p_Var16 + 3;
        if (cinfo->Se <= lVar14) {
          pjVar5 = cinfo->err;
          pjVar5->msg_code = 0x75;
          (*pjVar5->emit_message)((j_common_ptr)cinfo,-1);
          *(undefined4 *)&pjVar2[2].start_pass = 0xffffffff;
          return 1;
        }
      }
      iVar11 = arith_decode(cinfo,(uchar *)p_Var16);
      if (iVar11 != 0) {
        if (-1 < (*paJVar4)[iVar10]) {
          sVar6 = sVar7;
        }
        (*paJVar4)[iVar10] = (*paJVar4)[iVar10] + sVar6;
      }
LAB_0011312f:
      uVar9 = cinfo->Se;
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{   
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int s, k, r;
  unsigned int EOBRUN;
  int Se, p1, m1;
  const int * natural_order;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  BITREAD_STATE_VARS;
  d_derived_tbl * tbl;
  int num_newnz;
  int newnz_pos[DCTSIZE2];

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! process_restart(cinfo))
	return FALSE;
  }

  /* If we've run out of data, don't modify the MCU.
   */
  if (! entropy->insufficient_data) {

    Se = cinfo->Se;
    p1 = 1 << cinfo->Al;	/* 1 in the bit position being coded */
    m1 = (-1) << cinfo->Al;	/* -1 in the bit position being coded */
    natural_order = cinfo->natural_order;

    /* Load up working state */
    BITREAD_LOAD_STATE(cinfo,entropy->bitstate);
    EOBRUN = entropy->saved.EOBRUN; /* only part of saved state we need */

    /* There is always only one block per MCU */
    block = MCU_data[0];
    tbl = entropy->ac_derived_tbl;

    /* If we are forced to suspend, we must undo the assignments to any newly
     * nonzero coefficients in the block, because otherwise we'd get confused
     * next time about which coefficients were already nonzero.
     * But we need not undo addition of bits to already-nonzero coefficients;
     * instead, we can test the current bit to see if we already did it.
     */
    num_newnz = 0;

    /* initialize coefficient loop counter to start of band */
    k = cinfo->Ss;

    if (EOBRUN == 0) {
      for (; k <= Se; k++) {
	HUFF_DECODE(s, br_state, tbl, goto undoit, label3);
	r = s >> 4;
	s &= 15;
	if (s) {
	  if (s != 1)		/* size of new coef should always be 1 */
	    WARNMS(cinfo, JWRN_HUFF_BAD_CODE);
	  CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	  if (GET_BITS(1))
	    s = p1;		/* newly nonzero coef is positive */
	  else
	    s = m1;		/* newly nonzero coef is negative */
	} else {
	  if (r != 15) {
	    EOBRUN = 1 << r;	/* EOBr, run length is 2^r + appended bits */
	    if (r) {
	      CHECK_BIT_BUFFER(br_state, r, goto undoit);
	      r = GET_BITS(r);
	      EOBRUN += r;
	    }
	    break;		/* rest of block is handled by EOB logic */
	  }
	  /* note s = 0 for processing ZRL */
	}
	/* Advance over already-nonzero coefs and r still-zero coefs,
	 * appending correction bits to the nonzeroes.  A correction bit is 1
	 * if the absolute value of the coefficient must be increased.
	 */
	do {
	  thiscoef = *block + natural_order[k];
	  if (*thiscoef != 0) {
	    CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	    if (GET_BITS(1)) {
	      if ((*thiscoef & p1) == 0) { /* do nothing if already set it */
		if (*thiscoef >= 0)
		  *thiscoef += p1;
		else
		  *thiscoef += m1;
	      }
	    }
	  } else {
	    if (--r < 0)
	      break;		/* reached target zero coefficient */
	  }
	  k++;
	} while (k <= Se);
	if (s) {
	  int pos = natural_order[k];
	  /* Output newly nonzero coefficient */
	  (*block)[pos] = (JCOEF) s;
	  /* Remember its position in case we have to suspend */
	  newnz_pos[num_newnz++] = pos;
	}
      }
    }

    if (EOBRUN > 0) {
      /* Scan any remaining coefficient positions after the end-of-band
       * (the last newly nonzero coefficient, if any).  Append a correction
       * bit to each already-nonzero coefficient.  A correction bit is 1
       * if the absolute value of the coefficient must be increased.
       */
      for (; k <= Se; k++) {
	thiscoef = *block + natural_order[k];
	if (*thiscoef != 0) {
	  CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	  if (GET_BITS(1)) {
	    if ((*thiscoef & p1) == 0) { /* do nothing if already changed it */
	      if (*thiscoef >= 0)
		*thiscoef += p1;
	      else
		*thiscoef += m1;
	    }
	  }
	}
      }
      /* Count one block completed in EOB run */
      EOBRUN--;
    }

    /* Completed MCU, so update state */
    BITREAD_SAVE_STATE(cinfo,entropy->bitstate);
    entropy->saved.EOBRUN = EOBRUN; /* only part of saved state we need */
  }

  /* Account for restart interval (no-op if not using restarts) */
  entropy->restarts_to_go--;

  return TRUE;

undoit:
  /* Re-zero any output coefficients that we made newly nonzero */
  while (num_newnz > 0)
    (*block)[newnz_pos[--num_newnz]] = 0;

  return FALSE;
}